

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

int isdeclare(char *c)

{
  int iVar1;
  char *local_18;
  char *c_local;
  
  local_18 = c;
  while( true ) {
    iVar1 = isspace((int)*local_18);
    if (iVar1 == 0) break;
    local_18 = local_18 + 1;
  }
  if (*local_18 == '#') {
    c_local._4_4_ = 1;
  }
  else {
    iVar1 = strncmp(local_18,"extern",6);
    if (iVar1 == 0) {
      c_local._4_4_ = 1;
    }
    else {
      iVar1 = strncmp(local_18,"typedef",7);
      if (iVar1 == 0) {
        c_local._4_4_ = 1;
      }
      else {
        iVar1 = strncmp(local_18,"using",5);
        if (iVar1 == 0) {
          c_local._4_4_ = 1;
        }
        else {
          c_local._4_4_ = 0;
        }
      }
    }
  }
  return c_local._4_4_;
}

Assistant:

int isdeclare(const char *c) {
  while (isspace(*c)) c++;
  if (*c == '#') return 1;
  if (!strncmp(c,"extern",6)) return 1;
  if (!strncmp(c,"typedef",7)) return 1;
  if (!strncmp(c,"using",5)) return 1;
  return 0;
}